

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::GatherGeometryShader::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  GatherGeometryShader *this_local;
  
  local_18 = this;
  this_local = (GatherGeometryShader *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400               \nin vec4 col;               \nout vec4 f_out_0;          \nvoid main() {              \n   f_out_0 = col;          \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 400               \n"
			   "in vec4 col;               \n"
			   "out vec4 f_out_0;          \n"
			   "void main() {              \n"
			   "   f_out_0 = col;          \n"
			   "}";
	}